

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

void __thiscall ON_wString::CopyToArray(ON_wString *this,int size,wchar_t *s)

{
  ON_wStringHeader *hdr;
  ON_wStringHeader *pOVar1;
  ON_wStringHeader *hdr1;
  ON_wStringHeader *hdr0;
  wchar_t *s_local;
  int size_local;
  ON_wString *this_local;
  
  s_local._4_4_ = size;
  if (0xfffffffe < (ulong)(long)size) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
               ,0x21c,"","Requested size > ON_wString::MaximumStringLength.");
    s_local._4_4_ = 0;
  }
  if (((s_local._4_4_ < 1) || (s == (wchar_t *)0x0)) || (*s == L'\0')) {
    Destroy(this);
    Create(this);
  }
  else {
    hdr = Header(this);
    Create(this);
    ReserveArray(this,(long)s_local._4_4_);
    pOVar1 = Header(this);
    if ((pOVar1 != (ON_wStringHeader *)0x0) && (pOVar1 != pEmptyStringHeader)) {
      memcpy(this->m_s,s,(long)s_local._4_4_ << 2);
      pOVar1->string_length = s_local._4_4_;
      this->m_s[pOVar1->string_length] = L'\0';
    }
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero(hdr);
  }
  return;
}

Assistant:

void ON_wString::CopyToArray( int size, const wchar_t* s )
{
  if (size > ON_wString::MaximumStringLength)
  {
    ON_ERROR("Requested size > ON_wString::MaximumStringLength.");
    size = 0;
  }

  if ( size > 0 && s && s[0] )
  {
    ON_wStringHeader* hdr0 = Header();
    // Calling Create() here preserves hdr0 in case s is in its m_s[] buffer.
    Create();

    // ReserveArray() will allocate a new header
	  ReserveArray(size);
    ON_wStringHeader* hdr1 = Header();
    if (nullptr != hdr1 && hdr1 != pEmptyStringHeader)
    {
      memcpy(m_s, s, size * sizeof(*m_s));
      hdr1->string_length = size;
      m_s[hdr1->string_length] = 0;
    }
    // "this" no longer requires access to the original header
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero(hdr0);
  }
  else
  {
    Destroy();
    Create();
  }
}